

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O1

int merge_update(quicly_ranges_t *ranges,uint64_t start,uint64_t end,size_t slot,size_t end_slot)

{
  quicly_range_t *pqVar1;
  int extraout_EAX;
  
  pqVar1 = ranges->ranges;
  if (start < pqVar1[slot].start) {
    pqVar1[slot].start = start;
  }
  if (end < pqVar1[end_slot].end) {
    end = pqVar1[end_slot].end;
  }
  pqVar1[slot].end = end;
  if (slot == end_slot) {
    return (int)pqVar1;
  }
  quicly_ranges_drop_by_range_indices(ranges,slot + 1,end_slot + 1);
  return extraout_EAX;
}

Assistant:

static inline int merge_update(quicly_ranges_t *ranges, uint64_t start, uint64_t end, size_t slot, size_t end_slot)
{
    if (start < ranges->ranges[slot].start)
        ranges->ranges[slot].start = start;
    ranges->ranges[slot].end = end < ranges->ranges[end_slot].end ? ranges->ranges[end_slot].end : end;

    if (slot != end_slot)
        quicly_ranges_drop_by_range_indices(ranges, slot + 1, end_slot + 1);

    return 0;
}